

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O0

void Js::InlineCache::OutputPropertyValue<false,_false,_(Js::CacheType)4,_(Js::SlotType)1>::impl
               (InlineCache *cache,Var instance,RecyclableObject *propertyObject,
               PropertyId propertyId,Var *propertyValue,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  DynamicObject *sourceObject;
  RecyclableObject *local_40;
  RecyclableObject *function;
  ScriptContext *requestContext_local;
  Var *propertyValue_local;
  PropertyId propertyId_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  InlineCache *cache_local;
  
  if (((cache->u).accessor.field_1.rawUInt16 >> 1 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x1ac,"(cache->u.accessor.flags & InlineCacheGetterFlag)",
                                "cache->u.accessor.flags & InlineCacheGetterFlag");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((cache->u).accessor.field_1.rawUInt16 >> 3 & 1) == 0) {
    sourceObject = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(propertyObject);
    pvVar4 = GetPropertyValue<(Js::SlotType)1>(sourceObject,(uint)(cache->u).accessor.slotIndex);
    local_40 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
  }
  else {
    pvVar4 = GetPropertyValue<(Js::SlotType)1>
                       ((cache->u).accessor.object,(uint)(cache->u).accessor.slotIndex);
    local_40 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
  }
  pvVar4 = Js::JavascriptOperators::CallGetter(local_40,instance,requestContext);
  *propertyValue = pvVar4;
  return;
}

Assistant:

static void impl(
                InlineCache* cache,
                Var const instance,
                RecyclableObject *const propertyObject,
                const PropertyId propertyId,
                Var *const propertyValue,
                ScriptContext *const requestContext)
            {
                Assert(cache->u.accessor.flags & InlineCacheGetterFlag);

                RecyclableObject * function;
                if (cache->u.accessor.isOnProto)
                {
                    function = UnsafeVarTo<RecyclableObject>(cache->GetPropertyValue<slotType>(cache->u.accessor.object, cache->u.accessor.slotIndex));
                }
                else
                {
                    function = UnsafeVarTo<RecyclableObject>(cache->GetPropertyValue<slotType>(UnsafeVarTo<DynamicObject>(propertyObject), cache->u.accessor.slotIndex));
                }

                *propertyValue = JavascriptOperators::CallGetter(function, instance, requestContext);

                // Can't assert because the getter could have a side effect
#ifdef CHKGETTER
                Assert(JavascriptOperators::Equal(*propertyValue, JavascriptOperators::GetProperty(propertyObject, propertyId, requestContext), requestContext));
#endif
            }